

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O2

void __thiscall
boost::random::
well_engine<unsigned_int,32ul,19ul,1ul,16ul,15ul,14ul,boost::random::detail::M3<19>,boost::random::detail::M3<11>,boost::random::detail::M3<-14>,boost::random::detail::M1,boost::random::detail::M3<18>,boost::random::detail::M1,boost::random::detail::M0,boost::random::detail::M3<-5>,boost::random::detail::no_tempering>
::seed<unsigned_int*>
          (well_engine<unsigned_int,32ul,19ul,1ul,16ul,15ul,14ul,boost::random::detail::M3<19>,boost::random::detail::M3<11>,boost::random::detail::M3<_14>,boost::random::detail::M1,boost::random::detail::M3<18>,boost::random::detail::M1,boost::random::detail::M0,boost::random::detail::M3<_5>,boost::random::detail::no_tempering>
           *this,uint **first,uint *last)

{
  long lVar1;
  size_t j;
  long lVar2;
  
  detail::fill_array_int_impl<32,19ul,unsigned_int*,unsigned_int>(first,last,(uint (*) [19])this);
  *(undefined8 *)(this + 0x50) = 0x13;
  if (*(uint *)this < 2) {
    lVar2 = 1;
    do {
      if (lVar2 == 0x13) {
        *(undefined4 *)this = 0x80000000;
        return;
      }
      lVar1 = lVar2 * 4;
      lVar2 = lVar2 + 1;
    } while (*(int *)(this + lVar1) == 0);
  }
  return;
}

Assistant:

void seed(InputIterator& first, InputIterator last)
    {
        detail::fill_array_int<w>(first, last, state_);
        index_ = state_size;

        // fix up the state if it's all zeros.
        if ((state_[0] & (~static_cast<UIntType>(0) << mask_bits)) == 0) {
            for (std::size_t j = 1; j < state_size; ++j) {
                if (state_[j] != 0)
                    return;
            }

            state_[0] = static_cast<UIntType>(1) << (w - 1);
        }
    }